

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::print(JSPrinter *this,Ref node)

{
  char *pcVar1;
  Ref *pRVar2;
  IString *pIVar3;
  Ref local_20;
  Ref node_local;
  
  local_20.inst = node.inst;
  ensure(this,100);
  switch((node.inst)->type) {
  case String:
    printName(this,node);
    return;
  case Number:
    printNum(this,node);
    return;
  case Assign_:
    printAssign(this,node);
    return;
  case AssignName_:
    printAssignName(this,node);
    return;
  }
  pRVar2 = Ref::operator[](&local_20,0);
  pIVar3 = cashew::Value::getIString(pRVar2->inst);
  pcVar1 = (pIVar3->str)._M_str;
  switch(*pcVar1) {
  case 'a':
    if (pcVar1 != (char *)ARRAY._8_8_) {
LAB_0077b557:
      abort();
    }
    printArray(this,local_20);
    break;
  case 'b':
    if (pcVar1 == (char *)BINARY._8_8_) {
      printBinary(this,local_20);
    }
    else if (pcVar1 == (char *)BLOCK._8_8_) {
      printBlock(this,local_20);
    }
    else {
      if (pcVar1 != (char *)BREAK._8_8_) goto LAB_0077b557;
      printBreak(this,local_20);
    }
    break;
  case 'c':
    if (pcVar1 == (char *)CALL._8_8_) {
      printCall(this,local_20);
    }
    else if (pcVar1 == (char *)CONDITIONAL._8_8_) {
      printConditional(this,local_20);
    }
    else {
      if (pcVar1 != (char *)CONTINUE._8_8_) goto LAB_0077b557;
      printContinue(this,local_20);
    }
    break;
  case 'd':
    if (pcVar1 == (char *)DEFUN._8_8_) {
      printDefun(this,local_20);
    }
    else if (pcVar1 == (char *)DO._8_8_) {
      printDo(this,local_20);
    }
    else {
      if (pcVar1 != (char *)DOT._8_8_) goto LAB_0077b557;
      printDot(this,local_20);
    }
    break;
  default:
    fprintf(_stderr,"cannot yet print %s\n\n");
    abort();
  case 'i':
    if (pcVar1 != (char *)IF._8_8_) goto LAB_0077b557;
    printIf(this,local_20);
    break;
  case 'l':
    if (pcVar1 != (char *)LABEL._8_8_) goto LAB_0077b557;
    printLabel(this,local_20);
    break;
  case 'n':
    if (pcVar1 != (char *)NEW._8_8_) goto LAB_0077b557;
    printNew(this,local_20);
    break;
  case 'o':
    if (pcVar1 == (char *)OBJECT._8_8_) {
      printObject(this,local_20);
    }
    break;
  case 'r':
    if (pcVar1 != (char *)RETURN._8_8_) goto LAB_0077b557;
    printReturn(this,local_20);
    break;
  case 's':
    if (pcVar1 == (char *)SUB._8_8_) {
      printSub(this,local_20);
    }
    else if (pcVar1 == (char *)SEQ._8_8_) {
      printSeq(this,local_20);
    }
    else if (pcVar1 == (char *)SWITCH._8_8_) {
      printSwitch(this,local_20);
    }
    else {
      if (pcVar1 != (char *)STRING._8_8_) goto LAB_0077b557;
      printString(this,local_20);
    }
    break;
  case 't':
    if (pcVar1 == (char *)TOPLEVEL._8_8_) {
      printToplevel(this,local_20);
    }
    else {
      if (pcVar1 != (char *)TRY._8_8_) goto LAB_0077b557;
      printTry(this,local_20);
    }
    break;
  case 'u':
    if (pcVar1 != (char *)UNARY_PREFIX._8_8_) goto LAB_0077b557;
    printUnaryPrefix(this,local_20);
    break;
  case 'v':
    if (pcVar1 != (char *)VAR._8_8_) goto LAB_0077b557;
    printVar(this,local_20);
    break;
  case 'w':
    if (pcVar1 != (char *)WHILE._8_8_) goto LAB_0077b557;
    printWhile(this,local_20);
  }
  return;
}

Assistant:

void print(Ref node) {
    ensure();
    if (node->isString()) {
      printName(node);
      return;
    }
    if (node->isNumber()) {
      printNum(node);
      return;
    }
    if (node->isAssignName()) {
      printAssignName(node);
      return;
    }
    if (node->isAssign()) {
      printAssign(node);
      return;
    }
    IString type = node[0]->getIString();
    switch (type.str[0]) {
      case 'a': {
        if (type == ARRAY) {
          printArray(node);
        } else {
          abort();
        }
        break;
      }
      case 'b': {
        if (type == BINARY) {
          printBinary(node);
        } else if (type == BLOCK) {
          printBlock(node);
        } else if (type == BREAK) {
          printBreak(node);
        } else {
          abort();
        }
        break;
      }
      case 'c': {
        if (type == CALL) {
          printCall(node);
        } else if (type == CONDITIONAL) {
          printConditional(node);
        } else if (type == CONTINUE) {
          printContinue(node);
        } else {
          abort();
        }
        break;
      }
      case 'd': {
        if (type == DEFUN) {
          printDefun(node);
        } else if (type == DO) {
          printDo(node);
        } else if (type == DOT) {
          printDot(node);
        } else {
          abort();
        }
        break;
      }
      case 'i': {
        if (type == IF) {
          printIf(node);
        } else {
          abort();
        }
        break;
      }
      case 'l': {
        if (type == LABEL) {
          printLabel(node);
        } else {
          abort();
        }
        break;
      }
      case 'n': {
        if (type == NEW) {
          printNew(node);
        } else {
          abort();
        }
        break;
      }
      case 'o': {
        if (type == OBJECT) {
          printObject(node);
        }
        break;
      }
      case 'r': {
        if (type == RETURN) {
          printReturn(node);
        } else {
          abort();
        }
        break;
      }
      case 's': {
        if (type == SUB) {
          printSub(node);
        } else if (type == SEQ) {
          printSeq(node);
        } else if (type == SWITCH) {
          printSwitch(node);
        } else if (type == STRING) {
          printString(node);
        } else {
          abort();
        }
        break;
      }
      case 't': {
        if (type == TOPLEVEL) {
          printToplevel(node);
        } else if (type == TRY) {
          printTry(node);
        } else {
          abort();
        }
        break;
      }
      case 'u': {
        if (type == UNARY_PREFIX) {
          printUnaryPrefix(node);
        } else {
          abort();
        }
        break;
      }
      case 'v': {
        if (type == VAR) {
          printVar(node);
        } else {
          abort();
        }
        break;
      }
      case 'w': {
        if (type == WHILE) {
          printWhile(node);
        } else {
          abort();
        }
        break;
      }
      default: {
        errv("cannot yet print %s\n", type.str.data());
        abort();
      }
    }
  }